

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

float * __thiscall cimg_library::CImg<float>::min(CImg<float> *this)

{
  float *pfVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  CImgInstanceException *this_00;
  float *pfVar5;
  long lVar6;
  char *pcVar7;
  float fVar8;
  
  pfVar4 = this->_data;
  if ((((pfVar4 != (float *)0x0) && (this->_width != 0)) && (this->_height != 0)) &&
     ((this->_depth != 0 && (this->_spectrum != 0)))) {
    lVar6 = (ulong)this->_spectrum * (ulong)this->_depth *
            (ulong)this->_height * (ulong)this->_width;
    if (0 < lVar6) {
      pfVar1 = pfVar4 + lVar6;
      fVar8 = *pfVar4;
      pfVar5 = pfVar4;
      do {
        fVar2 = *pfVar5;
        pfVar3 = pfVar5;
        if (fVar8 <= *pfVar5) {
          fVar2 = fVar8;
          pfVar3 = pfVar4;
        }
        pfVar4 = pfVar3;
        fVar8 = fVar2;
        pfVar5 = pfVar5 + 1;
      } while (pfVar5 < pfVar1);
    }
    return pfVar4;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  pcVar7 = "non-";
  if (this->_is_shared != false) {
    pcVar7 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::min(): Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar7,"float");
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,std::exception::~exception);
}

Assistant:

const T& min() const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_min = _data;
      T min_value = *ptr_min;
      cimg_for(*this,ptrs,T) if (*ptrs<min_value) min_value = *(ptr_min=ptrs);
      return *ptr_min;
    }